

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigSat.c
# Opt level: O3

int Fraig_NodeIsEquivalent
              (Fraig_Man_t *p,Fraig_Node_t *pOld,Fraig_Node_t *pNew,int nBTLimit,int nTimeLimit)

{
  Fraig_Node_t *pFVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  int *pModel;
  Fraig_NodeVec_t *pFVar6;
  long lVar7;
  Msat_Solver_t *p_00;
  long lVar8;
  double dVar9;
  timespec ts;
  int local_54;
  timespec local_50;
  Fraig_Node_t *local_40;
  int local_34;
  
  local_34 = nTimeLimit;
  if (((ulong)pNew & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigSat.c"
                  ,0x136,
                  "int Fraig_NodeIsEquivalent(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *, int, int)"
                 );
  }
  if (((ulong)pOld & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigSat.c"
                  ,0x137,
                  "int Fraig_NodeIsEquivalent(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *, int, int)"
                 );
  }
  if (pNew == pOld) {
    __assert_fail("pNew != pOld",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigSat.c"
                  ,0x138,
                  "int Fraig_NodeIsEquivalent(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *, int, int)"
                 );
  }
  local_54 = nBTLimit;
  if ((0 < nBTLimit) && (((pOld->field_0x19 & 2) != 0 || ((pNew->field_0x19 & 2) != 0)))) {
    p->nSatFails = p->nSatFails + 1;
    if ((uint)nBTLimit < 0xb) {
      return 0;
    }
    local_54 = (int)SQRT((double)nBTLimit);
  }
  p->nSatCalls = p->nSatCalls + 1;
  p_00 = p->pSat;
  if (p_00 == (Msat_Solver_t *)0x0) {
    Fraig_ManCreateSolver(p);
    p_00 = p->pSat;
  }
  iVar2 = Msat_SolverReadVarNum(p_00);
  pFVar6 = p->vNodes;
  if (iVar2 < pFVar6->nSize) {
    lVar8 = (long)iVar2;
    do {
      Msat_SolverAddVar(p->pSat,pFVar6->pArray[lVar8]->Level);
      lVar8 = lVar8 + 1;
      pFVar6 = p->vNodes;
    } while (lVar8 < pFVar6->nSize);
  }
  nMuxes = 0;
  iVar2 = clock_gettime(3,&local_50);
  if (iVar2 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  local_40 = pOld;
  Fraig_OrderVariables(p,pOld,pNew);
  iVar2 = clock_gettime(3,&local_50);
  if (iVar2 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  p->timeTrav = p->timeTrav + lVar7 + lVar8;
  pfVar5 = Msat_SolverReadFactors(p->pSat);
  if (pfVar5 != (float *)0x0) {
    iVar2 = pNew->Level;
    if (pNew->Level < local_40->Level) {
      iVar2 = local_40->Level;
    }
    iVar3 = Msat_IntVecReadSize(p->vVarsInt);
    if (0 < iVar3) {
      iVar3 = 0;
      do {
        iVar4 = Msat_IntVecReadEntry(p->vVarsInt,iVar3);
        pFVar1 = p->vNodes->pArray[iVar4];
        dVar9 = pow(0.97,(double)(iVar2 - pFVar1->Level));
        pfVar5[pFVar1->Num] = (float)dVar9;
        iVar3 = iVar3 + 1;
        iVar4 = Msat_IntVecReadSize(p->vVarsInt);
      } while (iVar3 < iVar4);
    }
  }
  pFVar1 = local_40;
  iVar2 = Fraig_NodeComparePhase(local_40,pNew);
  Msat_SolverPrepare(p->pSat,p->vVarsInt);
  Msat_IntVecClear(p->vProj);
  Msat_IntVecPush(p->vProj,pFVar1->Num * 2);
  Msat_IntVecPush(p->vProj,(uint)(iVar2 == 0) + pNew->Num * 2);
  iVar3 = clock_gettime(3,&local_50);
  if (iVar3 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  iVar3 = Msat_SolverSolve(p->pSat,p->vProj,local_54,local_34);
  iVar4 = clock_gettime(3,&local_50);
  if (iVar4 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  p->timeSat = p->timeSat + lVar7 + lVar8;
  if (iVar3 == 1) {
LAB_0068d162:
    pModel = Msat_SolverReadModelArray(p->pSat);
    Fraig_FeedBack(p,pModel,p->vVarsInt,local_40,pNew);
    p->nSatCounter = p->nSatCounter + 1;
  }
  else {
    if (iVar3 == -1) {
      Msat_IntVecClear(p->vProj);
      pFVar1 = local_40;
      Msat_IntVecPush(p->vProj,local_40->Num * 2 + 1);
      Msat_IntVecPush(p->vProj,iVar2 + pNew->Num * 2);
      iVar3 = Msat_SolverAddClause(p->pSat,p->vProj);
      if (iVar3 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigSat.c"
                      ,0x197,
                      "int Fraig_NodeIsEquivalent(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *, int, int)"
                     );
      }
      if (p->pConst1 == pFVar1) {
        return 1;
      }
      Msat_SolverPrepare(p->pSat,p->vVarsInt);
      Msat_IntVecClear(p->vProj);
      Msat_IntVecPush(p->vProj,pFVar1->Num * 2 + 1);
      Msat_IntVecPush(p->vProj,iVar2 + pNew->Num * 2);
      iVar3 = clock_gettime(3,&local_50);
      if (iVar3 < 0) {
        lVar8 = 1;
      }
      else {
        lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
        lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_50.tv_sec * -1000000;
      }
      iVar3 = Msat_SolverSolve(p->pSat,p->vProj,local_54,local_34);
      iVar4 = clock_gettime(3,&local_50);
      if (iVar4 < 0) {
        lVar7 = -1;
      }
      else {
        lVar7 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
      }
      p->timeSat = p->timeSat + lVar7 + lVar8;
      if (iVar3 == 1) goto LAB_0068d162;
      if (iVar3 == -1) {
        Msat_IntVecClear(p->vProj);
        Msat_IntVecPush(p->vProj,local_40->Num * 2);
        Msat_IntVecPush(p->vProj,(uint)(iVar2 == 0) + pNew->Num * 2);
        iVar2 = Msat_SolverAddClause(p->pSat,p->vProj);
        if (iVar2 != 0) {
          p->nSatProof = p->nSatProof + 1;
          return 1;
        }
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigSat.c"
                      ,0x1e4,
                      "int Fraig_NodeIsEquivalent(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *, int, int)"
                     );
      }
      iVar2 = clock_gettime(3,&local_50);
      if (iVar2 < 0) {
        lVar7 = -1;
      }
      else {
        lVar7 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
      }
      p->time3 = p->time3 + lVar7 + lVar8;
      local_40->field_0x19 = local_40->field_0x19 | 2;
    }
    else {
      iVar2 = clock_gettime(3,&local_50);
      if (iVar2 < 0) {
        lVar7 = -1;
      }
      else {
        lVar7 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
      }
      p->time3 = p->time3 + lVar7 + lVar8;
      if (p->pConst1 != local_40) {
        local_40->field_0x19 = local_40->field_0x19 | 2;
      }
    }
    pNew->field_0x19 = pNew->field_0x19 | 2;
    p->nSatFailsReal = p->nSatFailsReal + 1;
  }
  return 0;
}

Assistant:

int Fraig_NodeIsEquivalent( Fraig_Man_t * p, Fraig_Node_t * pOld, Fraig_Node_t * pNew, int nBTLimit, int nTimeLimit )
{
    int RetValue, RetValue1, i, fComp;
    abctime clk;
    int fVerbose = 0;
    int fSwitch = 0;

    // make sure the nodes are not complemented
    assert( !Fraig_IsComplement(pNew) );
    assert( !Fraig_IsComplement(pOld) );
    assert( pNew != pOld );

    // if at least one of the nodes is a failed node, perform adjustments:
    // if the backtrack limit is small, simply skip this node
    // if the backtrack limit is > 10, take the quare root of the limit
    if ( nBTLimit > 0 && (pOld->fFailTfo || pNew->fFailTfo) )
    {
        p->nSatFails++;
//            return 0;
//        if ( nBTLimit > 10 )
//            nBTLimit /= 10;
        if ( nBTLimit <= 10 )
            return 0;
        nBTLimit = (int)sqrt((double)nBTLimit);
//        fSwitch = 1;
    }

    p->nSatCalls++;

    // make sure the solver is allocated and has enough variables
    if ( p->pSat == NULL )
        Fraig_ManCreateSolver( p );
    // make sure the SAT solver has enough variables
    for ( i = Msat_SolverReadVarNum(p->pSat); i < p->vNodes->nSize; i++ )
        Msat_SolverAddVar( p->pSat, p->vNodes->pArray[i]->Level );


 
/*
    {
        Fraig_Node_t * ppNodes[2] = { pOld, pNew };
        extern void Fraig_MappingShowNodes( Fraig_Man_t * pMan, Fraig_Node_t ** ppRoots, int nRoots, char * pFileName );
        Fraig_MappingShowNodes( p, ppNodes, 2, "temp_aig" );
    }
*/

    nMuxes = 0;


    // get the logic cone
clk = Abc_Clock();
//    Fraig_VarsStudy( p, pOld, pNew );
    Fraig_OrderVariables( p, pOld, pNew );
//    Fraig_PrepareCones( p, pOld, pNew );
p->timeTrav += Abc_Clock() - clk;

//    printf( "The number of MUXes detected = %d (%5.2f %% of logic).  ", nMuxes, 300.0*nMuxes/(p->vNodes->nSize - p->vInputs->nSize) );
//    ABC_PRT( "Time", Abc_Clock() - clk );

    if ( fVerbose )
        printf( "%d(%d) - ", Fraig_CountPis(p,p->vVarsInt), Msat_IntVecReadSize(p->vVarsInt) );


    // prepare variable activity
    Fraig_SetActivity( p, pOld, pNew );

    // get the complemented attribute
    fComp = Fraig_NodeComparePhase( pOld, pNew );
//Msat_SolverPrintClauses( p->pSat );

    ////////////////////////////////////////////
    // prepare the solver to run incrementally on these variables
//clk = Abc_Clock();
    Msat_SolverPrepare( p->pSat, p->vVarsInt );
//p->time3 += Abc_Clock() - clk;


    // solve under assumptions
    // A = 1; B = 0     OR     A = 1; B = 1 
    Msat_IntVecClear( p->vProj );
    Msat_IntVecPush( p->vProj, MSAT_VAR2LIT(pOld->Num, 0) );
    Msat_IntVecPush( p->vProj, MSAT_VAR2LIT(pNew->Num, !fComp) );

//Msat_SolverWriteDimacs( p->pSat, "temp_fraig.cnf" );

    // run the solver
clk = Abc_Clock();
    RetValue1 = Msat_SolverSolve( p->pSat, p->vProj, nBTLimit, nTimeLimit );
p->timeSat += Abc_Clock() - clk;

    if ( RetValue1 == MSAT_FALSE )
    {
//p->time1 += Abc_Clock() - clk;

if ( fVerbose )
{
//    printf( "unsat  %d  ", Msat_SolverReadBackTracks(p->pSat) );
//ABC_PRT( "time", Abc_Clock() - clk );
}

        // add the clause
        Msat_IntVecClear( p->vProj );
        Msat_IntVecPush( p->vProj, MSAT_VAR2LIT(pOld->Num, 1) );
        Msat_IntVecPush( p->vProj, MSAT_VAR2LIT(pNew->Num, fComp) );
        RetValue = Msat_SolverAddClause( p->pSat, p->vProj );
        assert( RetValue );
        // continue solving the other implication
    }
    else if ( RetValue1 == MSAT_TRUE )
    {
//p->time2 += Abc_Clock() - clk;

if ( fVerbose )
{
//    printf( "sat  %d  ", Msat_SolverReadBackTracks(p->pSat) );
//ABC_PRT( "time", Abc_Clock() - clk );
}

        // record the counter example
        Fraig_FeedBack( p, Msat_SolverReadModelArray(p->pSat), p->vVarsInt, pOld, pNew );

//        if ( pOld->fFailTfo || pNew->fFailTfo )
//            printf( "*" );
//        printf( "s(%d)", pNew->Level );
        if ( fSwitch )
             printf( "s(%d)", pNew->Level );
        p->nSatCounter++;
        return 0;
    }
    else // if ( RetValue1 == MSAT_UNKNOWN )
    {
p->time3 += Abc_Clock() - clk;

//        if ( pOld->fFailTfo || pNew->fFailTfo )
//            printf( "*" );
//        printf( "T(%d)", pNew->Level );

        // mark the node as the failed node
        if ( pOld != p->pConst1 ) 
            pOld->fFailTfo = 1;
        pNew->fFailTfo = 1;
//        p->nSatFails++;
        if ( fSwitch )
             printf( "T(%d)", pNew->Level );
        p->nSatFailsReal++;
        return 0;
    }

    // if the old node was constant 0, we already know the answer
    if ( pOld == p->pConst1 )
        return 1;

    ////////////////////////////////////////////
    // prepare the solver to run incrementally 
//clk = Abc_Clock();
    Msat_SolverPrepare( p->pSat, p->vVarsInt );
//p->time3 += Abc_Clock() - clk;
    // solve under assumptions
    // A = 0; B = 1     OR     A = 0; B = 0 
    Msat_IntVecClear( p->vProj );
    Msat_IntVecPush( p->vProj, MSAT_VAR2LIT(pOld->Num, 1) );
    Msat_IntVecPush( p->vProj, MSAT_VAR2LIT(pNew->Num, fComp) );
    // run the solver
clk = Abc_Clock();
    RetValue1 = Msat_SolverSolve( p->pSat, p->vProj, nBTLimit, nTimeLimit );
p->timeSat += Abc_Clock() - clk;

    if ( RetValue1 == MSAT_FALSE )
    {
//p->time1 += Abc_Clock() - clk;

if ( fVerbose )
{
//    printf( "unsat  %d  ", Msat_SolverReadBackTracks(p->pSat) );
//ABC_PRT( "time", Abc_Clock() - clk );
}

        // add the clause
        Msat_IntVecClear( p->vProj );
        Msat_IntVecPush( p->vProj, MSAT_VAR2LIT(pOld->Num, 0) );
        Msat_IntVecPush( p->vProj, MSAT_VAR2LIT(pNew->Num, !fComp) );
        RetValue = Msat_SolverAddClause( p->pSat, p->vProj );
        assert( RetValue );
        // continue solving the other implication
    }
    else if ( RetValue1 == MSAT_TRUE )
    {
//p->time2 += Abc_Clock() - clk;

if ( fVerbose )
{
//    printf( "sat  %d  ", Msat_SolverReadBackTracks(p->pSat) );
//ABC_PRT( "time", Abc_Clock() - clk );
}

        // record the counter example
        Fraig_FeedBack( p, Msat_SolverReadModelArray(p->pSat), p->vVarsInt, pOld, pNew );
        p->nSatCounter++;

//        if ( pOld->fFailTfo || pNew->fFailTfo )
//            printf( "*" );
//        printf( "s(%d)", pNew->Level );
        if ( fSwitch )
             printf( "s(%d)", pNew->Level );
        return 0;
    }
    else // if ( RetValue1 == MSAT_UNKNOWN )
    {
p->time3 += Abc_Clock() - clk;

//        if ( pOld->fFailTfo || pNew->fFailTfo )
//            printf( "*" );
//        printf( "T(%d)", pNew->Level );
        if ( fSwitch )
             printf( "T(%d)", pNew->Level );

        // mark the node as the failed node
        pOld->fFailTfo = 1;
        pNew->fFailTfo = 1;
//        p->nSatFails++;
        p->nSatFailsReal++;
        return 0;
    }

    // return SAT proof
    p->nSatProof++;

//    if ( pOld->fFailTfo || pNew->fFailTfo )
//        printf( "*" );
//    printf( "u(%d)", pNew->Level );

    if ( fSwitch )
         printf( "u(%d)", pNew->Level );

    return 1;
}